

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meparser.cpp
# Opt level: O1

void std::
     __move_median_to_first<__gnu_cxx::__normal_iterator<FPT_PARTITION_INFO*,std::vector<FPT_PARTITION_INFO,std::allocator<FPT_PARTITION_INFO>>>,__gnu_cxx::__ops::_Iter_less_iter>
               (undefined8 *__result,undefined8 *__a,undefined8 *__b,undefined8 *__c)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  
  uVar1 = *(uint *)(__a + 1);
  uVar2 = *(uint *)(__b + 1);
  uVar3 = *(uint *)(__c + 1);
  if (uVar1 < uVar2) {
    if (uVar2 < uVar3) {
LAB_00122d63:
      uVar4 = *__result;
      uVar5 = __result[1];
      uVar6 = __result[2];
      uVar7 = __result[3];
      uVar8 = __result[4];
      uVar9 = __result[5];
      uVar10 = __result[6];
      uVar11 = __result[7];
      uVar12 = *__b;
      uVar13 = __b[1];
      uVar14 = __b[2];
      uVar15 = __b[3];
      uVar16 = __b[4];
      uVar17 = __b[5];
      uVar18 = __b[7];
      __result[6] = __b[6];
      __result[7] = uVar18;
      __result[4] = uVar16;
      __result[5] = uVar17;
      __result[2] = uVar14;
      __result[3] = uVar15;
      *__result = uVar12;
      __result[1] = uVar13;
      __b[6] = uVar10;
      __b[7] = uVar11;
      __b[4] = uVar8;
      __b[5] = uVar9;
      __b[2] = uVar6;
      __b[3] = uVar7;
      *__b = uVar4;
      __b[1] = uVar5;
      return;
    }
    if (uVar1 < uVar3) {
LAB_00122cfe:
      uVar4 = *__result;
      uVar5 = __result[1];
      uVar6 = __result[2];
      uVar7 = __result[3];
      uVar8 = __result[4];
      uVar9 = __result[5];
      uVar10 = __result[6];
      uVar11 = __result[7];
      uVar12 = *__c;
      uVar13 = __c[1];
      uVar14 = __c[2];
      uVar15 = __c[3];
      uVar16 = __c[4];
      uVar17 = __c[5];
      uVar18 = __c[7];
      __result[6] = __c[6];
      __result[7] = uVar18;
      __result[4] = uVar16;
      __result[5] = uVar17;
      __result[2] = uVar14;
      __result[3] = uVar15;
      *__result = uVar12;
      __result[1] = uVar13;
      __c[6] = uVar10;
      __c[7] = uVar11;
      __c[4] = uVar8;
      __c[5] = uVar9;
      __c[2] = uVar6;
      __c[3] = uVar7;
      *__c = uVar4;
      __c[1] = uVar5;
      return;
    }
  }
  else if (uVar3 <= uVar1) {
    if (uVar2 < uVar3) goto LAB_00122cfe;
    goto LAB_00122d63;
  }
  uVar4 = *__result;
  uVar5 = __result[1];
  uVar6 = __result[2];
  uVar7 = __result[3];
  uVar8 = __result[4];
  uVar9 = __result[5];
  uVar10 = __result[6];
  uVar11 = __result[7];
  uVar12 = *__a;
  uVar13 = __a[1];
  uVar14 = __a[2];
  uVar15 = __a[3];
  uVar16 = __a[4];
  uVar17 = __a[5];
  uVar18 = __a[7];
  __result[6] = __a[6];
  __result[7] = uVar18;
  __result[4] = uVar16;
  __result[5] = uVar17;
  __result[2] = uVar14;
  __result[3] = uVar15;
  *__result = uVar12;
  __result[1] = uVar13;
  __a[6] = uVar10;
  __a[7] = uVar11;
  __a[4] = uVar8;
  __a[5] = uVar9;
  __a[2] = uVar6;
  __a[3] = uVar7;
  *__a = uVar4;
  __a[1] = uVar5;
  return;
}

Assistant:

bool operator< (const FPT_PARTITION_INFO & lhs, const FPT_PARTITION_INFO & rhs){ return lhs.ptEntry.Offset < rhs.ptEntry.Offset; }